

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O1

dxil_spv_result
dxil_spv_create_converter_with_reflection
          (dxil_spv_parsed_blob blob,dxil_spv_parsed_blob reflection_blob,
          dxil_spv_converter *converter)

{
  dxil_spv_result dVar1;
  dxil_spv_converter pdVar2;
  
  pdVar2 = (dxil_spv_converter)operator_new(0x188,(nothrow_t *)&std::nothrow);
  if (pdVar2 == (dxil_spv_converter)0x0) {
    pdVar2 = (dxil_spv_converter)0x0;
  }
  else {
    pdVar2->bc_parser = &blob->bc;
    pdVar2->bc_reflection_parser = &reflection_blob->bc;
    (pdVar2->spirv).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pdVar2->spirv).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pdVar2->spirv).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pdVar2->entry_point)._M_dataplus._M_p = (pointer)&(pdVar2->entry_point).field_2;
    (pdVar2->entry_point)._M_string_length = 0;
    (pdVar2->entry_point).field_2._M_local_buf[0] = '\0';
    (pdVar2->compiled_entry_point)._M_dataplus._M_p =
         (pointer)&(pdVar2->compiled_entry_point).field_2;
    (pdVar2->compiled_entry_point)._M_string_length = 0;
    (pdVar2->compiled_entry_point).field_2._M_local_buf[0] = '\0';
    (pdVar2->analysis_warnings)._M_dataplus._M_p = (pointer)&(pdVar2->analysis_warnings).field_2;
    (pdVar2->analysis_warnings)._M_string_length = 0;
    (pdVar2->analysis_warnings).field_2._M_local_buf[0] = '\0';
    (pdVar2->remapper).super_ResourceRemappingInterface._vptr_ResourceRemappingInterface =
         (_func_int **)&PTR__ResourceRemappingInterface_001f8140;
    memset(&(pdVar2->remapper).srv_remapper,0,0xd2);
    pdVar2->workgroup_size[0] = 0;
    pdVar2->workgroup_size[1] = 0;
    *(undefined8 *)(pdVar2->workgroup_size + 2) = 0;
    pdVar2->wave_size_min = 0;
    pdVar2->wave_size_max = 0;
    pdVar2->wave_size_preferred = 0;
    pdVar2->heuristic_wave_size = 0;
    pdVar2->shader_feature_used[0] = false;
  }
  if (pdVar2 == (dxil_spv_converter)0x0) {
    dVar1 = DXIL_SPV_ERROR_OUT_OF_MEMORY;
  }
  else {
    *converter = pdVar2;
    dVar1 = DXIL_SPV_SUCCESS;
  }
  return dVar1;
}

Assistant:

dxil_spv_result dxil_spv_create_converter_with_reflection(dxil_spv_parsed_blob blob,
                                                          dxil_spv_parsed_blob reflection_blob,
                                                          dxil_spv_converter *converter)
{
	auto *conv = new (std::nothrow) dxil_spv_converter_s(blob->bc, reflection_blob ? &reflection_blob->bc : nullptr);
	if (!conv)
		return DXIL_SPV_ERROR_OUT_OF_MEMORY;

	*converter = conv;
	return DXIL_SPV_SUCCESS;
}